

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
pstore::json::details::number_matcher<pstore::json::null_output>::number_matcher
          (number_matcher<pstore::json::null_output> *this)

{
  (this->super_matcher<pstore::json::null_output>).state_ = 2;
  (this->super_matcher<pstore::json::null_output>)._vptr_matcher =
       (_func_int **)&PTR__matcher_001b5358;
  *(undefined2 *)&(this->super_matcher<pstore::json::null_output>).field_0xc = 0x100;
  this->int_acc_ = 0;
  (this->fp_acc_).frac_part = 0.0;
  (this->fp_acc_).frac_scale = 1.0;
  (this->fp_acc_).whole_part = 0.0;
  (this->fp_acc_).exp_is_negative = false;
  (this->fp_acc_).exponent = 0;
  return;
}

Assistant:

explicit constexpr matcher (int const initial_state) noexcept
                        : state_{initial_state} {}